

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_convert.cpp
# Opt level: O0

void test_norm(string *orig,string *normal,norm_type type)

{
  string *in_RSI;
  string *in_RDI;
  norm_type in_stack_00000124;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000130;
  wstring local_a8 [32];
  wstring local_88 [16];
  string *in_stack_ffffffffffffff88;
  string local_58 [32];
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RDI);
  std::__cxx11::string::string(local_58,in_RSI);
  test_normc<char>(in_stack_00000130,in_stack_00000128,in_stack_00000124);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  to<wchar_t>(in_stack_ffffffffffffff88);
  to<wchar_t>(in_stack_ffffffffffffff88);
  test_normc<wchar_t>((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                      in_stack_00000130,
                      (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                      in_stack_00000128,in_stack_00000124);
  std::__cxx11::wstring::~wstring(local_a8);
  std::__cxx11::wstring::~wstring(local_88);
  return;
}

Assistant:

void test_norm(std::string orig,std::string normal,booster::locale::norm_type type)
{
    test_normc<char>(orig,normal,type);
    test_normc<wchar_t>(to<wchar_t>(orig),to<wchar_t>(normal),type);
    #ifdef BOOSTER_HAS_CHAR16_T
    test_normc<char16_t>(to<char16_t>(orig),to<char16_t>(normal),type);
    #endif
    #ifdef BOOSTER_HAS_CHAR32_T
    test_normc<char32_t>(to<char32_t>(orig),to<char32_t>(normal),type);
    #endif
}